

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pystring.cpp
# Opt level: O0

string * pystring::mul(string *__return_storage_ptr__,string *str,int n)

{
  int local_19c;
  ostringstream local_198 [4];
  int i;
  ostringstream os;
  int n_local;
  string *str_local;
  
  if (n < 1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)empty_string_abi_cxx11_)
    ;
  }
  else if (n == 1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_198);
    for (local_19c = 0; local_19c < n; local_19c = local_19c + 1) {
      std::operator<<((ostream *)local_198,(string *)str);
    }
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string mul( const std::string & str, int n )
    {
        // Early exits
        if (n <= 0) return empty_string;
        if (n == 1) return str;
        
        std::ostringstream os;
        for(int i=0; i<n; ++i)
        {
            os << str;
        }
        return os.str();
    }